

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxExtensions.cpp
# Opt level: O0

int sfglx_LoadFunctions(Display *display,int screen)

{
  char *strExtList;
  int screen_local;
  Display *display_local;
  
  ClearExtensionVars();
  strExtList = (char *)glXQueryExtensionsString(display,screen);
  ProcExtsFromExtString(strExtList);
  return 1;
}

Assistant:

int sfglx_LoadFunctions(Display* display, int screen)
{
    ClearExtensionVars();


    ProcExtsFromExtString(reinterpret_cast<const char*>(glXQueryExtensionsString(display, screen)));
    return sfglx_LOAD_SUCCEEDED;
}